

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

bool Cipher::normalizeSimilarityMap
               (TParameters *params,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  pointer pvVar1;
  long lVar2;
  int i_1;
  int i_2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  int i;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pvVar1 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (int)((long)(ccMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) * -0x55555555
  ;
  if ((int)uVar3 < 2) {
    dVar10 = 1e-06;
    dVar11 = 1.79769313486232e+308;
  }
  else {
    dVar11 = 1.79769313486232e+308;
    dVar10 = 2.2250738585072014e-308;
    uVar4 = 1;
    lVar5 = 0x10;
    uVar8 = 0;
    do {
      uVar6 = uVar8 + 1;
      pdVar7 = (double *)
               (*(long *)&pvVar1[uVar8].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                          _M_impl.super__Vector_impl_data + lVar5);
      uVar8 = (ulong)(uVar3 & 0x7fffffff);
      dVar9 = dVar10;
      dVar12 = dVar11;
      do {
        dVar10 = *pdVar7;
        dVar11 = dVar10;
        if (dVar12 <= dVar10) {
          dVar11 = dVar12;
        }
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        pdVar7 = pdVar7 + 2;
        uVar8 = uVar8 - 1;
        dVar9 = dVar10;
        dVar12 = dVar11;
      } while (uVar4 != uVar8);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
      uVar8 = uVar6;
    } while (uVar6 != uVar3 - 1);
    dVar11 = dVar11 + -1e-06;
    dVar10 = dVar10 + 1e-06;
  }
  if ((int)uVar3 < 1) {
    std::
    vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
    ::operator=(logMap,ccMap);
  }
  else {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    uVar8 = 0;
    do {
      lVar5 = 0;
      uVar6 = 0;
      do {
        lVar2 = *(long *)&(ccMap->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        if (uVar8 == uVar6) {
          *(undefined8 *)(lVar2 + uVar8 * 0x10) = 0x3ff0000000000000;
        }
        else {
          dVar9 = (*(double *)(lVar2 + lVar5) - dVar11) / (dVar10 - dVar11);
          *(double *)(lVar2 + lVar5) = dVar9;
          dVar9 = pow(dVar9,params->fSpread);
          *(double *)(lVar2 + lVar5) = dVar9;
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar4 != uVar6);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar4);
    std::
    vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
    ::operator=(logMap,ccMap);
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        lVar5 = 0;
        uVar6 = 0;
        do {
          lVar2 = *(long *)&(logMap->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data;
          if (uVar8 == uVar6) {
            *(undefined8 *)(lVar2 + uVar8 * 0x10) = 0;
          }
          else {
            dVar10 = log(*(double *)(lVar2 + lVar5));
            *(double *)(lVar2 + lVar5) = dVar10;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 != uVar6);
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uVar3 & 0x7fffffff));
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::operator=(logMapInv,ccMap);
      if ((int)uVar3 < 1) {
        return true;
      }
      uVar8 = 0;
      do {
        lVar5 = 0;
        uVar4 = 0;
        do {
          if (uVar8 == uVar4) {
            *(undefined8 *)
             (*(long *)&(logMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data + uVar8 * 0x10) = 0xc12e848000000000;
          }
          else {
            lVar2 = *(long *)&(logMapInv->
                              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar8].
                              super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                              super__Vector_impl_data;
            dVar10 = log(1.0 - *(double *)(lVar2 + lVar5));
            *(double *)(lVar2 + lVar5) = dVar10;
          }
          uVar4 = uVar4 + 1;
          lVar5 = lVar5 + 0x10;
        } while ((uVar3 & 0x7fffffff) != uVar4);
        uVar8 = uVar8 + 1;
      } while (uVar8 != (uVar3 & 0x7fffffff));
      return true;
    }
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & params,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        //printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                v = std::pow(v, params.fSpread);
                //if (v < 0.50) {
                //    v = 1e-6;
                //}
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }